

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O3

Literal * __thiscall wasm::Literal::extendS16(Literal *__return_storage_ptr__,Literal *this)

{
  uintptr_t uVar1;
  
  uVar1 = (this->type).id;
  if (uVar1 == 3) {
    *(long *)&__return_storage_ptr__->field_0 = (long)*(short *)&this->field_0;
  }
  else {
    if (uVar1 != 2) {
      handle_unreachable("invalid type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                         ,0x31d);
    }
    *(int *)&__return_storage_ptr__->field_0 = (int)*(short *)&this->field_0;
  }
  (__return_storage_ptr__->type).id = uVar1;
  return __return_storage_ptr__;
}

Assistant:

bool operator==(const BasicType& other) const { return id == other; }